

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O1

bool __thiscall QtPrivate::QCalendarView::event(QCalendarView *this,QEvent *event)

{
  bool bVar1;
  
  bVar1 = QAbstractItemView::event((QAbstractItemView *)this,event);
  return bVar1;
}

Assistant:

bool QCalendarView::event(QEvent *event)
{
#ifdef QT_KEYPAD_NAVIGATION
    if (event->type() == QEvent::FocusIn) {
        if (QCalendarModel *calendarModel = qobject_cast<QCalendarModel *>(model())) {
            origDate = calendarModel->m_date;
        }
    }
#endif

    return QTableView::event(event);
}